

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_tas_8_d(void)

{
  uint *puVar1;
  uint *r_dst;
  
  puVar1 = m68ki_cpu.dar + (m68ki_cpu.ir & 7);
  m68ki_cpu.not_z_flag = *puVar1 & 0xff;
  m68ki_cpu.n_flag = *puVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  *puVar1 = *puVar1 | 0x80;
  return;
}

Assistant:

static void m68k_op_tas_8_d(void)
{
	uint* r_dst = &DY;

	FLAG_Z = MASK_OUT_ABOVE_8(*r_dst);
	FLAG_N = NFLAG_8(*r_dst);
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
	*r_dst |= 0x80;
}